

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodes_Statements.h
# Opt level: O2

void __thiscall
psy::C::FunctionDefinitionSyntax::~FunctionDefinitionSyntax(FunctionDefinitionSyntax *this)

{
  C::SyntaxNode::~SyntaxNode((SyntaxNode *)this);
  Managed::operator_delete(this);
  return;
}

Assistant:

class PSY_C_API FunctionDefinitionSyntax final : public DeclarationSyntax
{
    AST_NODE_1K(FunctionDefinition, Declaration)

public:
    const SpecifierListSyntax* specifiers() const { return specs_; }
    const DeclaratorSyntax* declarator() const { return decltor_; }
    const ExtKR_ParameterDeclarationListSyntax* extKR_params() const { return extKR_params_; }
    const CompoundStatementSyntax* body() const { return body_; }

private:
    SpecifierListSyntax* specs_ = nullptr;
    DeclaratorSyntax* decltor_ = nullptr;
    ExtKR_ParameterDeclarationListSyntax* extKR_params_ = nullptr;
    CompoundStatementSyntax* body_ = nullptr;
    AST_CHILD_LST4(specs_, decltor_, extKR_params_, body_);
}